

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

Quat4f __thiscall Quat4f::slerp(Quat4f *this,Quat4f *a,Quat4f *b,float t,bool allowFlip)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  Quat4f QVar8;
  
  fVar1 = dot(a,b);
  if (0.009999999776482582 <= 1.0 - (double)ABS(fVar1)) {
    dVar3 = acos((double)ABS(fVar1));
    fVar2 = (float)dVar3;
    dVar3 = sin((double)fVar2);
    dVar4 = sin((double)((1.0 - t) * fVar2));
    dVar3 = (double)(float)dVar3;
    auVar5._0_8_ = sin((double)(fVar2 * t));
    auVar5._8_8_ = dVar4;
    auVar6._8_4_ = SUB84(dVar3,0);
    auVar6._0_8_ = dVar3;
    auVar6._12_4_ = (int)((ulong)dVar3 >> 0x20);
    auVar6 = divpd(auVar5,auVar6);
    t = (float)auVar6._0_8_;
    fVar2 = (float)auVar6._8_8_;
  }
  else {
    fVar2 = 1.0 - t;
  }
  fVar7 = fVar2;
  if (allowFlip) {
    fVar7 = -fVar2;
  }
  fVar1 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar2 | (uint)fVar7 & -(uint)(fVar1 < 0.0));
  auVar6 = *(undefined1 (*) [16])a->m_elements;
  QVar8.m_elements._0_8_ = auVar6._0_8_;
  auVar5 = *(undefined1 (*) [16])b->m_elements;
  this->m_elements[0] = fVar1 * auVar6._0_4_ + t * auVar5._0_4_;
  this->m_elements[1] = fVar1 * auVar6._4_4_ + t * auVar5._4_4_;
  this->m_elements[2] = fVar1 * auVar6._8_4_ + t * auVar5._8_4_;
  this->m_elements[3] = fVar1 * auVar6._12_4_ + t * auVar5._12_4_;
  QVar8.m_elements[2] = (float)(int)auVar5._0_8_;
  QVar8.m_elements[3] = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  return (Quat4f)QVar8.m_elements;
}

Assistant:

Quat4f Quat4f::slerp( const Quat4f& a, const Quat4f& b, float t, bool allowFlip )
{
	float cosAngle = Quat4f::dot( a, b );

	float c1;
	float c2;

	// Linear interpolation for close orientations
	if( ( 1.0f - fabs( cosAngle ) ) < 0.01f )
	{
		c1 = 1.0f - t;
		c2 = t;
	}
	else
	{
		// Spherical interpolation
		float angle = acos( fabs( cosAngle ) );
		float sinAngle = sin( angle );
		c1 = sin( angle * ( 1.0f - t ) ) / sinAngle;
		c2 = sin( angle * t ) / sinAngle;
	}

	// Use the shortest path
	if( allowFlip && ( cosAngle < 0.0f ) )
	{
		c1 = -c1;
	}

	return Quat4f( c1 * a[ 0 ] + c2 * b[ 0 ], c1 * a[ 1 ] + c2 * b[ 1 ], c1 * a[ 2 ] + c2 * b[ 2 ], c1 * a[ 3 ] + c2 * b[ 3 ] );
}